

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

string * __thiscall
Connection::to_string_abi_cxx11_(string *__return_storage_ptr__,Connection *this)

{
  _Base_ptr *pp_Var1;
  _Rb_tree_header *p_Var2;
  pointer pcVar3;
  size_type sVar4;
  long lVar5;
  long *plVar6;
  _Rb_tree_node_base *p_Var7;
  size_type *psVar8;
  long *plVar9;
  char *pcVar10;
  char *pcVar11;
  undefined1 uVar12;
  initializer_list<char> __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string newLabel;
  allocator_type local_c9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pp_Var1 = &local_a0._M_impl.super__Rb_tree_header._M_header._M_parent;
  pcVar3 = (this->name_from)._M_dataplus._M_p;
  local_a0._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar3,pcVar3 + (this->name_from)._M_string_length);
  std::__cxx11::string::append((char *)&local_a0);
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_a0,(ulong)(this->name_to)._M_dataplus._M_p);
  local_c8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_c8;
  psVar8 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar8) {
    lVar5 = plVar6[3];
    local_c8->_M_allocated_capacity = *psVar8;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar5;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
  }
  __return_storage_ptr__->_M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((_Base_ptr *)local_a0._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)local_a0._M_impl._0_8_,
                    (ulong)((long)&(local_a0._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                   _M_color + 1));
  }
  if ((this->label)._M_string_length != 0) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_c0 = (long *)CONCAT17(local_c0._7_1_,0xa29283b227d7b);
    __l._M_len = 7;
    __l._M_array = (iterator)&local_c0;
    std::set<char,_std::less<char>,_std::allocator<char>_>::set
              ((set<char,_std::less<char>,_std::allocator<char>_> *)&local_a0,__l,
               (less<char> *)&local_50,&local_c9);
    sVar4 = (this->label)._M_string_length;
    if (sVar4 != 0) {
      pcVar10 = (this->label)._M_dataplus._M_p;
      pcVar11 = pcVar10 + sVar4;
      p_Var2 = &local_a0._M_impl.super__Rb_tree_header;
      do {
        uVar12 = *pcVar10;
        if (uVar12 != 10) {
          p_Var7 = local_a0._M_impl.super__Rb_tree_header._M_header._M_left;
          if (uVar12 == 0x23) {
            uVar12 = 0x5f;
          }
          while (((_Rb_tree_header *)p_Var7 != p_Var2 && ((char)p_Var7[1]._M_color != uVar12))) {
            p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
          }
          if ((_Rb_tree_header *)p_Var7 != p_Var2) {
            std::__cxx11::string::push_back((char)&local_70);
          }
          std::__cxx11::string::push_back((char)&local_70);
        }
        pcVar10 = pcVar10 + 1;
      } while (pcVar10 != pcVar11);
    }
    std::operator+(&local_50,"[label=\"",&local_70);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
    plVar9 = plVar6 + 2;
    if ((long *)*plVar6 == plVar9) {
      local_b0 = *plVar9;
      lStack_a8 = plVar6[3];
      local_c0 = &local_b0;
    }
    else {
      local_b0 = *plVar9;
      local_c0 = (long *)*plVar6;
    }
    local_b8 = plVar6[1];
    *plVar6 = (long)plVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_c0);
    if (local_c0 != &local_b0) {
      operator_delete(local_c0,local_b0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
    ~_Rb_tree(&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string Connection::to_string() {
    string str = name_from + "->" + name_to;
    if (!label.empty()) {
        std::string newLabel;
        std::set<char> escapeChars = {'{', '}', '"', ';', '(', ')', '\n'};
        int i = 0;
        for (char c: label) {
            if (c == '\n')
                continue;
            if (c == '#')
                c = '_';
            i++;
            if (std::find(escapeChars.begin(), escapeChars.end(), c) != escapeChars.end()) {
                newLabel += '\\';
            }
            newLabel += c;
        }
        str += "[label=\"" + newLabel + "\"]";
    }
    return str;
}